

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O0

int64_t memory_read_skip(archive *a,void *client_data,int64_t skip)

{
  long lVar1;
  read_memory_data_conflict *mine;
  int64_t skip_local;
  void *client_data_local;
  archive *a_local;
  
  mine = (read_memory_data_conflict *)skip;
  if (*(long *)((long)client_data + 0x10) - *(long *)((long)client_data + 8) < skip) {
    mine = (read_memory_data_conflict *)
           (*(long *)((long)client_data + 0x10) - *(long *)((long)client_data + 8));
  }
  lVar1 = *(long *)((long)client_data + 0x18) * ((long)mine / *(long *)((long)client_data + 0x18));
  *(long *)((long)client_data + 8) = lVar1 + *(long *)((long)client_data + 8);
  return lVar1;
}

Assistant:

static int64_t
memory_read_skip(struct archive *a, void *client_data, int64_t skip)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;

	(void)a; /* UNUSED */
	if ((int64_t)skip > (int64_t)(mine->end - mine->p))
		skip = mine->end - mine->p;
	/* Round down to block size. */
	skip /= mine->read_size;
	skip *= mine->read_size;
	mine->p += skip;
	return (skip);
}